

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O0

Id __thiscall spv::Builder::makeDoubleConstant(Builder *this,double d,bool specConstant)

{
  Id IVar1;
  Instruction *this_00;
  size_t size;
  unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> local_70 [3];
  Instruction *local_58;
  Instruction *c;
  uint local_48;
  Id existing;
  uint op2;
  uint op1;
  unsigned_long_long value;
  anon_union_8_2_743ac23a u;
  Op local_28;
  Id typeId;
  Op opcode;
  bool specConstant_local;
  double d_local;
  Builder *this_local;
  
  local_28 = OpConstant;
  if (specConstant) {
    local_28 = OpSpecConstant;
  }
  size = 0x40;
  typeId._3_1_ = specConstant;
  _opcode = d;
  d_local = (double)this;
  u.ull._4_4_ = makeFloatType(this,0x40);
  value = (unsigned_long_long)_opcode;
  _op2 = _opcode;
  existing = SUB84(_opcode,0);
  local_48 = (uint)((ulong)_opcode >> 0x20);
  if ((typeId._3_1_ & 1) == 0) {
    size = 0x16;
    IVar1 = findScalarConstant(this,OpTypeFloat,local_28,u.ull._4_4_,existing,local_48);
    if (IVar1 != 0) {
      return IVar1;
    }
    c._4_4_ = 0;
  }
  this_00 = (Instruction *)Instruction::operator_new((Instruction *)0x38,size);
  IVar1 = getUniqueId(this);
  Instruction::Instruction(this_00,IVar1,u.ull._4_4_,local_28);
  local_58 = this_00;
  Instruction::addImmediateOperand(this_00,existing);
  Instruction::addImmediateOperand(local_58,local_48);
  std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>::
  unique_ptr<std::default_delete<spv::Instruction>,void>
            ((unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>> *)local_70,local_58
            );
  std::
  vector<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
  ::push_back(&this->constantsTypesGlobals,(value_type *)local_70);
  std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr(local_70);
  std::vector<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>::push_back
            (this->groupedConstants + 0x16,&local_58);
  Module::mapInstruction(&this->module,local_58);
  IVar1 = Instruction::getResultId(local_58);
  return IVar1;
}

Assistant:

Id Builder::makeDoubleConstant(double d, bool specConstant)
{
    Op opcode = specConstant ? OpSpecConstant : OpConstant;
    Id typeId = makeFloatType(64);
    union { double db; unsigned long long ull; } u;
    u.db = d;
    unsigned long long value = u.ull;
    unsigned op1 = value & 0xFFFFFFFF;
    unsigned op2 = value >> 32;

    // See if we already made it. Applies only to regular constants, because specialization constants
    // must remain distinct for the purpose of applying a SpecId decoration.
    if (! specConstant) {
        Id existing = findScalarConstant(OpTypeFloat, opcode, typeId, op1, op2);
        if (existing)
            return existing;
    }

    Instruction* c = new Instruction(getUniqueId(), typeId, opcode);
    c->addImmediateOperand(op1);
    c->addImmediateOperand(op2);
    constantsTypesGlobals.push_back(std::unique_ptr<Instruction>(c));
    groupedConstants[OpTypeFloat].push_back(c);
    module.mapInstruction(c);

    return c->getResultId();
}